

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O2

float Imath_3_2::anon_unknown_20::maxOffDiag<float>(Matrix44<float> *A)

{
  int i;
  long lVar1;
  int j;
  long lVar2;
  float fVar3;
  float fVar4;
  
  fVar3 = 0.0;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      fVar4 = fVar3;
      if ((lVar1 != lVar2) &&
         (fVar4 = ABS((*(float (*) [4])*(float (*) [4])A)[lVar2]), fVar4 <= fVar3)) {
        fVar4 = fVar3;
      }
      fVar3 = fVar4;
    }
    A = (Matrix44<float> *)((long)A + 0x10);
  }
  return fVar3;
}

Assistant:

IMATH_CONSTEXPR14 T
maxOffDiag (const IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A)
{
    T result = 0;
    for (int i = 0; i < 4; ++i)
    {
        for (int j = 0; j < 4; ++j)
        {
            if (i != j) result = std::max (result, std::abs (A[i][j]));
        }
    }

    return result;
}